

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxCues.cpp
# Opt level: O2

bool __thiscall libmatroska::KaxCues::AddBlockBlob(KaxCues *this,KaxBlockBlob *BlockReference)

{
  KaxBlockBlob *pKVar1;
  pointer ppKVar2;
  KaxBlockBlob *local_8;
  
  ppKVar2 = (this->myTempReferences).
            super__Vector_base<const_libmatroska::KaxBlockBlob_*,_std::allocator<const_libmatroska::KaxBlockBlob_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppKVar2 ==
        (this->myTempReferences).
        super__Vector_base<const_libmatroska::KaxBlockBlob_*,_std::allocator<const_libmatroska::KaxBlockBlob_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_8 = BlockReference;
      std::vector<libmatroska::KaxBlockBlob_const*,std::allocator<libmatroska::KaxBlockBlob_const*>>
      ::emplace_back<libmatroska::KaxBlockBlob_const*>
                ((vector<libmatroska::KaxBlockBlob_const*,std::allocator<libmatroska::KaxBlockBlob_const*>>
                  *)&this->myTempReferences,&local_8);
      return true;
    }
    pKVar1 = *ppKVar2;
    ppKVar2 = ppKVar2 + 1;
  } while (pKVar1 != BlockReference);
  return true;
}

Assistant:

bool KaxCues::AddBlockBlob(const KaxBlockBlob & BlockReference)
{
  // Do not add the element if it's already present.
  std::vector<const KaxBlockBlob *>::iterator ListIdx;

  for (ListIdx = myTempReferences.begin(); ListIdx != myTempReferences.end(); ++ListIdx)
    if (*ListIdx == &BlockReference)
      return true;

  myTempReferences.push_back(&BlockReference);
  return true;
}